

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Consumable.cpp
# Opt level: O1

shared_ptr<Consumable> Consumable::generateConsumable(void)

{
  int iVar1;
  time_t tVar2;
  Consumable *this;
  char *pcVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  element_type *in_RDI;
  shared_ptr<Consumable> sVar5;
  string local_70;
  size_type *local_50;
  string hpn;
  
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  iVar1 = rand();
  iVar1 = iVar1 % 100;
  local_50 = &hpn._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Lesser Health Potion","");
  if (iVar1 < 0x51) {
    if (iVar1 < 0x33) goto LAB_00114b9e;
    pcVar3 = "Great Health Potion";
  }
  else {
    pcVar3 = "Greater Health Potion";
  }
  std::__cxx11::string::_M_replace((ulong)&local_50,0,hpn._M_dataplus._M_p,(ulong)pcVar3);
LAB_00114b9e:
  this = (Consumable *)operator_new(0x38);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_50,hpn._M_dataplus._M_p + (long)local_50);
  Consumable(this,&local_70,(long)iVar1);
  (in_RDI->super_Item)._vptr_Item = (_func_int **)this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Consumable*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(in_RDI->super_Item).type,this);
  _Var4._M_pi = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    _Var4._M_pi = extraout_RDX_00;
  }
  if (local_50 != &hpn._M_string_length) {
    operator_delete(local_50,hpn._M_string_length + 1);
    _Var4._M_pi = extraout_RDX_01;
  }
  sVar5.super___shared_ptr<Consumable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var4._M_pi;
  sVar5.super___shared_ptr<Consumable,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<Consumable>)sVar5.super___shared_ptr<Consumable,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Consumable> Consumable::generateConsumable() {
    unsigned seed = time(0);
    srand(seed);
    int hp = rand() % 100;
    std::string hpn = "Lesser Health Potion";
    if(hp > 80)
        hpn = "Greater Health Potion";
    else if(hp > 50)
        hpn = "Great Health Potion";

    std::shared_ptr<Consumable> cons(new Consumable(hpn, hp));

    return cons;
}